

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall Func::TryCodegen(Func *this)

{
  PAL_FILE *file;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JITTimeFunctionBody *pJVar4;
  undefined4 *puVar5;
  FunctionJITTimeInfo *topFunc;
  FlowGraph *this_00;
  PAL_FILE *pPVar6;
  undefined1 local_6d8 [8];
  IRBuilderAsmJs asmIrBuilder;
  GeneratorBailIn local_200;
  undefined1 local_1a8 [8];
  Lowerer lowerer;
  AutoCodeGenPhase __autoCodeGen;
  Security security;
  AutoCodeGenPhase __autoCodeGen_8;
  
  bVar2 = IsJitInDebugMode(this);
  if (bVar2) {
    pJVar4 = GetJITFunctionBody(this);
    bVar2 = JITTimeFunctionBody::HasTry(pJVar4);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x194,"(!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry())",
                         "!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry()");
      if (!bVar2) goto LAB_00409338;
      *puVar5 = 0;
    }
  }
  __autoCodeGen.func._0_4_ = 0x34;
  lowerer.m_lowerGeneratorHelper.epilogueForBailOut = (LabelInstr *)this;
  BeginPhase(this,BackEndPhase);
  lowerer.m_func._0_4_ = 0x35;
  local_1a8 = (undefined1  [8])this;
  BeginPhase(this,IRBuilderPhase);
  pJVar4 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar4);
  if (bVar2) {
    IRBuilderAsmJs::IRBuilderAsmJs((IRBuilderAsmJs *)local_6d8,this);
    IRBuilderAsmJs::Build((IRBuilderAsmJs *)local_6d8);
  }
  else {
    IRBuilder::IRBuilder((IRBuilder *)local_6d8,this);
    IRBuilder::Build((IRBuilder *)local_6d8);
    IRBuilder::~IRBuilder((IRBuilder *)local_6d8);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_1a8,this,IRBuilderPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_1a8);
  security.func._0_4_ = 0x3b;
  __autoCodeGen._8_8_ = this;
  BeginPhase(this,InlinePhase);
  topFunc = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  bVar2 = IsLoopBody(this);
  InliningHeuristics::InliningHeuristics((InliningHeuristics *)local_1a8,topFunc,bVar2);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)0x0;
  asmIrBuilder.m_funcAlloc = (JitArenaAllocator *)(ulong)(uint)asmIrBuilder.m_funcAlloc;
  asmIrBuilder.m_func._0_2_ = 0;
  asmIrBuilder.m_jnReader.m_startLocation = (byte *)0x0;
  asmIrBuilder.m_jnReader.m_currentLocation = (byte *)0x0;
  local_6d8 = (undefined1  [8])this;
  asmIrBuilder.m_lastInstr = (Instr *)local_1a8;
  Inline::Optimize((Inline *)local_6d8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&__autoCodeGen.phase,this,InlinePhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen.phase);
  ThrowIfScriptClosed(this);
  Memory::NoRecoverMemoryJitArenaAllocator::NoRecoverMemoryJitArenaAllocator
            ((NoRecoverMemoryJitArenaAllocator *)local_1a8,L"BE-FlowGraph",
             (this->m_alloc->super_ArenaAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,Js::Throw::OutOfMemory);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0x59);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,FGBuildPhase);
  this_00 = FlowGraph::New(this,(JitArenaAllocator *)local_1a8);
  this->m_fg = this_00;
  FlowGraph::Build(this_00);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,FGBuildPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  security.func._0_4_ = 0x5e;
  __autoCodeGen._8_8_ = this;
  BeginPhase(this,GlobOptPhase);
  GlobOpt::GlobOpt((GlobOpt *)local_6d8,this);
  GlobOpt::Optimize((GlobOpt *)local_6d8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&__autoCodeGen.phase,this,GlobOptPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&__autoCodeGen.phase);
  FlowGraph::Destroy(this->m_fg);
  this->m_fg = (FlowGraph *)0x0;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_1a8);
  ThrowIfScriptClosed(this);
  Lowerer::Lowerer((Lowerer *)local_1a8,this);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xc9);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,LowererPhase);
  Lowerer::Lower((Lowerer *)local_1a8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,LowererPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  security.func._0_4_ = 0;
  security.cookieOpnd = (IntConstOpnd *)0x0;
  security.currentConstSize = 0;
  security._12_4_ = 0;
  security.basePlusCookieOpnd = (RegOpnd *)0x0;
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xe4);
  local_6d8 = (undefined1  [8])this;
  __autoCodeGen._8_8_ = this;
  BeginPhase(this,EncodeConstantsPhase);
  Security::EncodeLargeConstants((Security *)&__autoCodeGen.phase);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,EncodeConstantsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  pJVar4 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::DoInterruptProbe(pJVar4);
  if (bVar2) {
    asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xe3);
    local_6d8 = (undefined1  [8])this;
    BeginPhase(this,InterruptProbePhase);
    Lowerer::DoInterruptProbes((Lowerer *)local_1a8);
    AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,InterruptProbePhase,true,true);
    AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  }
  security.baseOpnd = (RegOpnd *)this;
  BeginPhase(this,RegAllocPhase);
  LinearScan::LinearScan((LinearScan *)local_6d8,this);
  LinearScan::RegAlloc((LinearScan *)local_6d8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&security.baseOpnd,this,RegAllocPhase,true,true);
  LinearScan::GeneratorBailIn::~GeneratorBailIn(&local_200);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&security.baseOpnd);
  ThrowIfScriptClosed(this);
  security.baseOpnd = (RegOpnd *)this;
  BeginPhase(this,PeepsPhase);
  local_6d8 = (undefined1  [8])this;
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)this;
  asmIrBuilder.m_funcAlloc = (JitArenaAllocator *)this;
  Peeps::PeepFunc((Peeps *)local_6d8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&security.baseOpnd,this,PeepsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&security.baseOpnd);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xf0);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,LayoutPhase);
  security.baseOpnd = (RegOpnd *)this;
  SimpleLayout::Layout((SimpleLayout *)&security.baseOpnd);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,LayoutPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  BVar3 = HasTry(this);
  if ((BVar3 != 0) && ((this->field_0x240 & 0x20) != 0)) {
    asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xf1);
    local_6d8 = (undefined1  [8])this;
    BeginPhase(this,EHBailoutPatchUpPhase);
    Lowerer::EHBailoutPatchUp((Lowerer *)local_1a8);
    AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,EHBailoutPatchUpPhase,true,true);
    AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  }
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xf4);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,InsertNOPsPhase);
  Security::InsertNOPs((Security *)&__autoCodeGen.phase);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,InsertNOPsPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xf3);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,PrologEpilogPhase);
  pJVar4 = GetJITFunctionBody(this);
  bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar4);
  if (bVar2) {
    Lowerer::LowerPrologEpilogAsmJs((Lowerer *)local_1a8);
  }
  else {
    Lowerer::LowerPrologEpilog((Lowerer *)local_1a8);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,PrologEpilogPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)CONCAT44(asmIrBuilder.m_tempAlloc._4_4_,0xf2);
  local_6d8 = (undefined1  [8])this;
  BeginPhase(this,FinalLowerPhase);
  Lowerer::FinalLower((Lowerer *)local_1a8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_6d8,this,FinalLowerPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_6d8);
  security.baseOpnd = (RegOpnd *)this;
  BeginPhase(this,EncoderPhase);
  asmIrBuilder.m_argStack = (SListCounted<IR::Instr_*,_Memory::ArenaAllocator> *)0x0;
  asmIrBuilder.m_argOffsetStack._0_4_ = 0;
  asmIrBuilder.m_branchRelocList = (SList<BranchReloc_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  local_6d8 = (undefined1  [8])this;
  asmIrBuilder.m_tempAlloc = (JitArenaAllocator *)this;
  Encoder::Encode((Encoder *)local_6d8);
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)&security.baseOpnd,this,EncoderPhase,false,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)&security.baseOpnd);
  *(Lowerer **)((long)local_1a8 + 0x3b0) = (Lowerer *)0x0;
  bVar2 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,AsmDumpModeFlag);
  if (bVar2) {
    file = (PAL_FILE *)this->m_scriptContextInfo[0x254]._vptr_ScriptContextInfo[9];
    if (file == (PAL_FILE *)0x0) {
      pPVar6 = (PAL_FILE *)0x0;
    }
    else {
      pPVar6 = Output::SetFile(file);
    }
    Dump(this,IRDumpFlags_AsmDumpMode);
    Output::Flush();
    if (file != (PAL_FILE *)0x0) {
      pPVar6 = Output::SetFile(pPVar6);
      if (pPVar6 != file) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                           ,0x24c,"(openedFile == asmFile)","openedFile == asmFile");
        if (!bVar2) {
LAB_00409338:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
    }
  }
  AutoCodeGenPhase::EndPhase
            ((AutoCodeGenPhase *)&lowerer.m_lowerGeneratorHelper.epilogueForBailOut,this,
             BackEndPhase,true,true);
  AutoCodeGenPhase::~AutoCodeGenPhase
            ((AutoCodeGenPhase *)&lowerer.m_lowerGeneratorHelper.epilogueForBailOut);
  return;
}

Assistant:

void
Func::TryCodegen()
{
    Assert(!IsJitInDebugMode() || !GetJITFunctionBody()->HasTry());

    BEGIN_CODEGEN_PHASE(this, Js::BackEndPhase);
    {
        // IRBuilder

        BEGIN_CODEGEN_PHASE(this, Js::IRBuilderPhase);

#ifdef ASMJS_PLAT
        if (GetJITFunctionBody()->IsAsmJsMode())
        {
            IRBuilderAsmJs asmIrBuilder(this);
            asmIrBuilder.Build();
        }
        else
#endif
        {
            IRBuilder irBuilder(this);
            irBuilder.Build();
        }

        END_CODEGEN_PHASE(this, Js::IRBuilderPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::IRBuilderPhase);
#endif /* IR_VIEWER */

        BEGIN_CODEGEN_PHASE(this, Js::InlinePhase);

        InliningHeuristics heuristics(GetWorkItem()->GetJITTimeInfo(), this->IsLoopBody());
        Inline inliner(this, heuristics);
        inliner.Optimize();

        END_CODEGEN_PHASE(this, Js::InlinePhase);

        ThrowIfScriptClosed();

        // FlowGraph
        {
            // Scope for FlowGraph arena
            NoRecoverMemoryJitArenaAllocator fgAlloc(_u("BE-FlowGraph"), m_alloc->GetPageAllocator(), Js::Throw::OutOfMemory);

            BEGIN_CODEGEN_PHASE(this, Js::FGBuildPhase);

            this->m_fg = FlowGraph::New(this, &fgAlloc);
            this->m_fg->Build();

            END_CODEGEN_PHASE(this, Js::FGBuildPhase);

            // Global Optimization and Type Specialization
            BEGIN_CODEGEN_PHASE(this, Js::GlobOptPhase);

            GlobOpt globOpt(this);
            globOpt.Optimize();

            END_CODEGEN_PHASE(this, Js::GlobOptPhase);

            // Delete flowGraph now
            this->m_fg->Destroy();
            this->m_fg = nullptr;
        }

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::GlobOptPhase);
#endif /* IR_VIEWER */

        ThrowIfScriptClosed();

        // Lowering
        Lowerer lowerer(this);
        BEGIN_CODEGEN_PHASE(this, Js::LowererPhase);
        lowerer.Lower();
        END_CODEGEN_PHASE(this, Js::LowererPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::LowererPhase);
#endif /* IR_VIEWER */

        // Encode constants

        Security security(this);

        BEGIN_CODEGEN_PHASE(this, Js::EncodeConstantsPhase)
        security.EncodeLargeConstants();
        END_CODEGEN_PHASE(this, Js::EncodeConstantsPhase);
        if (GetJITFunctionBody()->DoInterruptProbe())
        {
            BEGIN_CODEGEN_PHASE(this, Js::InterruptProbePhase)
            lowerer.DoInterruptProbes();
            END_CODEGEN_PHASE(this, Js::InterruptProbePhase)
        }

        // Register Allocation

        BEGIN_CODEGEN_PHASE(this, Js::RegAllocPhase);

        LinearScan linearScan(this);
        linearScan.RegAlloc();

        END_CODEGEN_PHASE(this, Js::RegAllocPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::RegAllocPhase);
#endif /* IR_VIEWER */

        ThrowIfScriptClosed();

        // Peephole optimizations

        BEGIN_CODEGEN_PHASE(this, Js::PeepsPhase);

        Peeps peeps(this);
        peeps.PeepFunc();

        END_CODEGEN_PHASE(this, Js::PeepsPhase);

        // Layout

        BEGIN_CODEGEN_PHASE(this, Js::LayoutPhase);

        SimpleLayout layout(this);
        layout.Layout();

        END_CODEGEN_PHASE(this, Js::LayoutPhase);

        if (this->HasTry() && this->hasBailoutInEHRegion)
        {
            BEGIN_CODEGEN_PHASE(this, Js::EHBailoutPatchUpPhase);
            lowerer.EHBailoutPatchUp();
            END_CODEGEN_PHASE(this, Js::EHBailoutPatchUpPhase);
        }

        // Insert NOPs (moving this before prolog/epilog for AMD64 and possibly ARM).
        BEGIN_CODEGEN_PHASE(this, Js::InsertNOPsPhase);
        security.InsertNOPs();
        END_CODEGEN_PHASE(this, Js::InsertNOPsPhase);

        // Prolog/Epilog
        BEGIN_CODEGEN_PHASE(this, Js::PrologEpilogPhase);
        if (GetJITFunctionBody()->IsAsmJsMode())
        {
            lowerer.LowerPrologEpilogAsmJs();
        }
        else
        {
            lowerer.LowerPrologEpilog();
        }
        END_CODEGEN_PHASE(this, Js::PrologEpilogPhase);

        BEGIN_CODEGEN_PHASE(this, Js::FinalLowerPhase);
        lowerer.FinalLower();
        END_CODEGEN_PHASE(this, Js::FinalLowerPhase);

        // Encoder
        BEGIN_CODEGEN_PHASE(this, Js::EncoderPhase);

        Encoder encoder(this);
        encoder.Encode();

        END_CODEGEN_PHASE_NO_DUMP(this, Js::EncoderPhase);

#ifdef IR_VIEWER
        IRtoJSObjectBuilder::DumpIRtoGlobalObject(this, Js::EncoderPhase);
#endif /* IR_VIEWER */

    }

#if DBG_DUMP
    if (Js::Configuration::Global.flags.IsEnabled(Js::AsmDumpModeFlag))
    {
        FILE * oldFile = 0;
        FILE * asmFile = GetScriptContext()->GetNativeCodeGenerator()->asmFile;
        if (asmFile)
        {
            oldFile = Output::SetFile(asmFile);
        }

        this->Dump(IRDumpFlags_AsmDumpMode);

        Output::Flush();

        if (asmFile)
        {
            FILE *openedFile = Output::SetFile(oldFile);
            Assert(openedFile == asmFile);
        }
    }
#endif
    if (this->IsOOPJIT())
    {
        BEGIN_CODEGEN_PHASE(this, Js::NativeCodeDataPhase);

        auto dataAllocator = this->GetNativeCodeDataAllocator();
        if (dataAllocator->allocCount > 0)
        {
            NativeCodeData::DataChunk *chunk = (NativeCodeData::DataChunk*)dataAllocator->chunkList;
            NativeCodeData::DataChunk *next1 = chunk;
            while (next1)
            {
                if (next1->fixupFunc)
                {
                    next1->fixupFunc(next1->data, chunk);
                }
#if DBG
                if (CONFIG_FLAG(OOPJITFixupValidate))
                {
                    // Scan memory to see if there's missing pointer needs to be fixed up
                    // This can hit false positive if some data field happens to have value 
                    // falls into the NativeCodeData memory range.
                    NativeCodeData::DataChunk *next2 = chunk;
                    while (next2)
                    {
                        for (unsigned int i = 0; i < next1->len / sizeof(void*); i++)
                        {
                            if (((void**)next1->data)[i] == (void*)next2->data)
                            {
                                NativeCodeData::VerifyExistFixupEntry((void*)next2->data, &((void**)next1->data)[i], next1->data);
                            }
                        }
                        next2 = next2->next;
                    }
                }
#endif
                next1 = next1->next;
            }

            JITOutputIDL* jitOutputData = m_output.GetOutputData();
            size_t allocSize = offsetof(NativeDataFixupTable, fixupRecords) + sizeof(NativeDataFixupRecord)* (dataAllocator->allocCount);
            jitOutputData->nativeDataFixupTable = (NativeDataFixupTable*)midl_user_allocate(allocSize);
            if (!jitOutputData->nativeDataFixupTable)
            {
                Js::Throw::OutOfMemory();
            }
            __analysis_assume(jitOutputData->nativeDataFixupTable);
            jitOutputData->nativeDataFixupTable->count = dataAllocator->allocCount;

            jitOutputData->buffer = (NativeDataBuffer*)midl_user_allocate(offsetof(NativeDataBuffer, data) + dataAllocator->totalSize);
            if (!jitOutputData->buffer)
            {
                Js::Throw::OutOfMemory();
            }
            __analysis_assume(jitOutputData->buffer);

            jitOutputData->buffer->len = dataAllocator->totalSize;

            unsigned int len = 0;
            unsigned int count = 0;
            next1 = chunk;
            while (next1)
            {
                memcpy(jitOutputData->buffer->data + len, next1->data, next1->len);
                len += next1->len;

                jitOutputData->nativeDataFixupTable->fixupRecords[count].index = next1->allocIndex;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].length = next1->len;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].startOffset = next1->offset;
                jitOutputData->nativeDataFixupTable->fixupRecords[count].updateList = next1->fixupList;

                count++;
                next1 = next1->next;
            }

#if DBG
            if (PHASE_TRACE1(Js::NativeCodeDataPhase))
            {
                Output::Print(_u("NativeCodeData Server Buffer: %p, len: %x, chunk head: %p\n"), jitOutputData->buffer->data, jitOutputData->buffer->len, chunk);
            }
#endif
        }
        END_CODEGEN_PHASE(this, Js::NativeCodeDataPhase);
    }

    END_CODEGEN_PHASE(this, Js::BackEndPhase);
}